

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator<<(short lhs,
          SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits
          )

{
  long lVar1;
  short in_DI;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffd0;
  short local_14;
  short local_12;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2;
  
  local_12 = in_DI;
  lVar1 = SafeInt::operator_cast_to_long(in_stack_ffffffffffffffd0);
  if (lVar1 < 0) {
    __assert_fail("!std::numeric_limits< T >::is_signed || (T)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1b09,
                  "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = long, U = short, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
                 );
  }
  lVar1 = SafeInt::operator_cast_to_long(in_stack_ffffffffffffffd0);
  if (lVar1 < 0x10) {
    lVar1 = SafeInt::operator_cast_to_long(in_stack_ffffffffffffffd0);
    local_14 = (short)((int)local_12 << ((byte)lVar1 & 0x1f));
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_2,&local_14);
    return (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
           local_2.m_int;
  }
  __assert_fail("(T)bits < (int)safeint_internal::int_traits< U >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1b0a,
                "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = long, U = short, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< U, E > operator <<( U lhs, SafeInt< T, E > bits ) SAFEINT_NOTHROW
{
    ShiftAssert( !std::numeric_limits< T >::is_signed || (T)bits >= 0 );
    ShiftAssert( (T)bits < (int)safeint_internal::int_traits< U >::bitCount );

    return SafeInt< U, E >( (U)( lhs << (T)bits ) );
}